

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

char16 * __thiscall
Js::JavascriptString::GetNormalizedString
          (JavascriptString *this,NormalizationForm form,ArenaAllocator *tempAllocator,
          charcount_t *sizeOfNormalizedStringWithoutNullTerminator)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint destLength;
  int32 iVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined4 extraout_var_00;
  char16_t *destString;
  undefined4 extraout_var_01;
  char *message;
  charcount_t cVar6;
  uint lineNumber;
  ApiError local_34 [2];
  ApiError error;
  
  if (this->m_charLength == 0) {
    *sizeOfNormalizedStringWithoutNullTerminator = 0;
    return (char16 *)0x0;
  }
  scriptContext =
       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  bVar2 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (form,(char16 *)CONCAT44(extraout_var,iVar3),this->m_charLength);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xeb9,
                                "(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()))"
                                ,
                                "!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength())"
                               );
    if (!bVar2) goto LAB_00bbe0d3;
    *puVar5 = 0;
  }
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this);
  destLength = PlatformAgnostic::UnicodeText::NormalizeString
                         (form,(char16 *)CONCAT44(extraout_var_00,iVar3),this->m_charLength + 1,
                          (char16 *)0x0,0,local_34);
LAB_00bbdf47:
  switch(local_34[0]) {
  case NoError:
    goto switchD_00bbdf5b_caseD_0;
  case InvalidParameter:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    message = "Invalid Parameter- check pointers passed to NormalizeString";
    lineNumber = 0xed5;
    break;
  case InvalidUnicodeText:
    JavascriptError::ThrowRangeErrorVar(scriptContext,-0x7ff5ea1e,(ulong)destLength);
  case InsufficientBuffer:
    destString = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                           ((Memory *)tempAllocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,
                            0,(long)(int)destLength);
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(this);
    iVar4 = PlatformAgnostic::UnicodeText::NormalizeString
                      (form,(char16 *)CONCAT44(extraout_var_01,iVar3),this->m_charLength + 1,
                       destString,destLength,local_34);
    if (iVar4 < 1) goto code_r0x00bbdfa3;
    cVar6 = iVar4 - 1;
    goto LAB_00bbe009;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    message = "Unknown error";
    lineNumber = 0xee4;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                              ,lineNumber,"(false)",message);
  if (bVar2) {
    *puVar5 = 0;
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ea1d,(PCWSTR)0x0);
  }
  goto LAB_00bbe0d3;
code_r0x00bbdfa3:
  destLength = -iVar4;
  goto LAB_00bbdf47;
switchD_00bbdf5b_caseD_0:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                              ,0xedf,"(false)",
                              "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)"
                             );
  if (bVar2) {
    *puVar5 = 0;
    cVar6 = 0;
    destString = (char16_t *)0x0;
LAB_00bbe009:
    *sizeOfNormalizedStringWithoutNullTerminator = cVar6;
    return destString;
  }
LAB_00bbe0d3:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

char16* JavascriptString::GetNormalizedString(PlatformAgnostic::UnicodeText::NormalizationForm form, ArenaAllocator* tempAllocator, charcount_t& sizeOfNormalizedStringWithoutNullTerminator)
    {
        using namespace PlatformAgnostic;

        ScriptContext* scriptContext = this->GetScriptContext();
        if (this->GetLength() == 0)
        {
            sizeOfNormalizedStringWithoutNullTerminator = 0;
            return nullptr;
        }

        // IMPORTANT: Implementation Notes
        // Normalize string estimates the required size of the buffer based on averages and other data.
        // It is very hard to get a precise size from an input string without expanding/contracting it on the buffer.
        // It is estimated that the maximum size the string after an NFC is 6x the input length, and 18x for NFD. This approach isn't very feasible as well.
        // The approach taken is based on the simple example in the MSDN article.
        //  - Loop until the return value is either an error (apart from insufficient buffer size), or success.
        //  - Each time recreate a temporary buffer based on the last guess.
        //  - When creating the JS string, use the positive return value and copy the buffer across.
        // Design choice for "guesses" comes from data Windows collected; and in most cases the loop will not iterate more than 2 times.

        Assert(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()));

        //Get the first size estimate
        UnicodeText::ApiError error;
        int32 sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, nullptr, 0, &error);
        char16 *tmpBuffer = nullptr;
        //Loop while the size estimate is bigger than 0
        while (error == UnicodeText::ApiError::InsufficientBuffer)
        {
            tmpBuffer = AnewArray(tempAllocator, char16, sizeEstimate);
            sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, tmpBuffer, sizeEstimate, &error);

            // Success, sizeEstimate is the exact size including the null terminator
            if (sizeEstimate > 0)
            {
                sizeOfNormalizedStringWithoutNullTerminator = sizeEstimate - 1;
                return tmpBuffer;
            }

            // Anything less than 0, we have an error, flip sizeEstimate now. As both times we need to use it, we need positive anyways.
            sizeEstimate *= -1;

        }

        switch (error)
        {
            case UnicodeText::ApiError::InvalidParameter:
                //some invalid parameter, coding error
                AssertMsg(false, "Invalid Parameter- check pointers passed to NormalizeString");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
            case UnicodeText::ApiError::InvalidUnicodeText:
                //the value returned is the negative index of an invalid unicode character
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidUnicodeCharacter, sizeEstimate);
                break;
            case UnicodeText::ApiError::NoError:
                //The actual size of the output string is zero.
                //Theoretically only empty input string should produce this, which is handled above, thus the code path should not be hit.
                AssertMsg(false, "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)");
                sizeOfNormalizedStringWithoutNullTerminator = 0;
                return nullptr; // scriptContext->GetLibrary()->GetEmptyString();
                break;
            default:
                AssertMsg(false, "Unknown error");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
        }
    }